

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_reduce.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ListReduceBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  undefined1 auVar2 [8];
  undefined8 uVar3;
  bool bVar4;
  reference pvVar5;
  pointer pEVar6;
  BoundLambdaExpression *pBVar7;
  LogicalType *pLVar8;
  BinderException *pBVar9;
  bool has_initial;
  bool has_index;
  undefined1 local_c8 [8];
  undefined1 local_c0 [32];
  undefined1 local_a0 [16];
  _Head_base<0UL,_duckdb::Expression_*,_false> local_90;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_88;
  LogicalType initial_value_type;
  LogicalType list_child_type;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_50;
  LogicalType max_logical_type;
  
  pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,1);
  pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar5);
  if ((pEVar6->super_BaseExpression).expression_class != BOUND_LAMBDA) {
    pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)local_c0,"Invalid lambda expression!",(allocator *)&list_child_type);
    BinderException::BinderException(pBVar9,(string *)local_c0);
    __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  local_88._M_head_impl =
       (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  BoundCastExpression::AddArrayCastToList
            ((BoundCastExpression *)local_c0,context,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_88);
  pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  uVar3 = local_c0._0_8_;
  local_c0._0_8_ =
       (_Tuple_impl<0UL,_duckdb::ListLambdaBindData_*,_std::default_delete<duckdb::ListLambdaBindData>_>
        )0x0;
  _Var1._M_head_impl =
       (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar3;
  if (_Var1._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
  }
  if ((_Head_base<0UL,_duckdb::ListLambdaBindData_*,_false>)local_c0._0_8_ !=
      (_Head_base<0UL,_duckdb::ListLambdaBindData_*,_false>)0x0) {
    (*((FunctionData *)local_c0._0_8_)->_vptr_FunctionData[1])();
  }
  local_c0._0_8_ = (Expression *)0x0;
  if (local_88._M_head_impl != (Expression *)0x0) {
    (*((local_88._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_88._M_head_impl = (Expression *)0x0;
  pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,1);
  pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar5);
  pBVar7 = BaseExpression::Cast<duckdb::BoundLambdaExpression>(&pEVar6->super_BaseExpression);
  if ((pBVar7->parameter_count & 0xfffffffffffffffe) != 2) {
    pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)local_c0,"list_reduce expects a function with 2 or 3 arguments",
               (allocator *)&list_child_type);
    BinderException::BinderException(pBVar9,(string *)local_c0);
    __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  has_index = pBVar7->parameter_count == 3;
  LambdaFunctions::ListLambdaPrepareBind
            ((LambdaFunctions *)&local_50,arguments,context,bound_function);
  if (local_50._M_head_impl == (BoundCastData *)0x0) {
    pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,0);
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar5);
    LogicalType::LogicalType(&list_child_type,&pEVar6->return_type);
    pLVar8 = ListType::GetChildType(&list_child_type);
    LogicalType::operator=(&list_child_type,pLVar8);
    has_initial = (long)(arguments->
                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ).
                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(arguments->
                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ).
                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start == 0x18;
    if (has_initial) {
      pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(arguments,2);
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar5);
      LogicalType::LogicalType(&initial_value_type,&pEVar6->return_type);
      bVar4 = LogicalType::operator!=(&list_child_type,&initial_value_type);
      if (bVar4) {
        LogicalType::LogicalType(&max_logical_type);
        bVar4 = LogicalType::TryGetMaxLogicalType
                          (context,&list_child_type,&initial_value_type,&max_logical_type);
        if (!bVar4) {
          pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)local_c0,
                     "The initial value type must be the same as the list child type or a common super type"
                     ,(allocator *)local_c8);
          BinderException::BinderException(pBVar9,(string *)local_c0);
          __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        LogicalType::operator=(&list_child_type,&max_logical_type);
        pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::get<true>(arguments,0);
        local_a0._0_8_ =
             (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        LogicalType::LIST((LogicalType *)local_c0,&max_logical_type);
        BoundCastExpression::AddCastToType
                  ((BoundCastExpression *)local_c8,context,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   local_a0,(LogicalType *)local_c0,false);
        pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::get<true>(arguments,0);
        auVar2 = local_c8;
        local_c8 = (undefined1  [8])0x0;
        _Var1._M_head_impl =
             (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)auVar2;
        if (_Var1._M_head_impl != (Expression *)0x0) {
          (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
        }
        if (local_c8 != (undefined1  [8])0x0) {
          (**(code **)(*(_func_int **)local_c8 + 8))();
        }
        local_c8 = (undefined1  [8])0x0;
        LogicalType::~LogicalType((LogicalType *)local_c0);
        if ((Expression *)local_a0._0_8_ != (Expression *)0x0) {
          (**(code **)(*(long *)local_a0._0_8_ + 8))();
        }
        local_a0._0_8_ = 0;
        pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::get<true>(arguments,2);
        local_90._M_head_impl =
             (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        BoundCastExpression::AddCastToType
                  ((BoundCastExpression *)local_c0,context,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_90,&max_logical_type,false);
        pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::get<true>(arguments,2);
        uVar3 = local_c0._0_8_;
        local_c0._0_8_ =
             (_Tuple_impl<0UL,_duckdb::ListLambdaBindData_*,_std::default_delete<duckdb::ListLambdaBindData>_>
              )0x0;
        _Var1._M_head_impl =
             (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar3;
        if (_Var1._M_head_impl != (Expression *)0x0) {
          (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
        }
        if ((_Head_base<0UL,_duckdb::ListLambdaBindData_*,_false>)local_c0._0_8_ !=
            (_Head_base<0UL,_duckdb::ListLambdaBindData_*,_false>)0x0) {
          (*((FunctionData *)local_c0._0_8_)->_vptr_FunctionData[1])();
        }
        local_c0._0_8_ = (Expression *)0x0;
        if (local_90._M_head_impl != (Expression *)0x0) {
          (*((local_90._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_90._M_head_impl = (Expression *)0x0;
        LogicalType::~LogicalType(&max_logical_type);
      }
      LogicalType::~LogicalType(&initial_value_type);
    }
    local_a0._8_8_ =
         (pBVar7->lambda_expr).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pBVar7->lambda_expr).
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    BoundCastExpression::AddCastToType
              ((BoundCastExpression *)&initial_value_type,context,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               (local_a0 + 8),&list_child_type,false);
    if ((Expression *)local_a0._8_8_ != (Expression *)0x0) {
      (**(code **)(*(long *)local_a0._8_8_ + 8))();
    }
    local_a0._8_8_ = 0;
    if (initial_value_type._0_8_ == 0) {
      pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)local_c0,"Could not cast lambda expression to list child type",
                 (allocator *)&max_logical_type);
      BinderException::BinderException(pBVar9,(string *)local_c0);
      __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)&initial_value_type);
    pLVar8 = &(bound_function->super_BaseScalarFunction).return_type;
    LogicalType::operator=(pLVar8,&pEVar6->return_type);
    make_uniq<duckdb::ListLambdaBindData,duckdb::LogicalType&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,bool&,bool&>
              ((duckdb *)local_c0,pLVar8,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &initial_value_type,&has_index,&has_initial);
    uVar3 = local_c0._0_8_;
    local_c0._0_8_ = (ListLambdaBindData *)0x0;
    *(undefined8 *)this = uVar3;
    ::std::unique_ptr<duckdb::ListLambdaBindData,_std::default_delete<duckdb::ListLambdaBindData>_>
    ::~unique_ptr((unique_ptr<duckdb::ListLambdaBindData,_std::default_delete<duckdb::ListLambdaBindData>_>
                   *)local_c0);
    if (initial_value_type._0_8_ != 0) {
      (**(code **)(*(long *)initial_value_type._0_8_ + 8))();
    }
    LogicalType::~LogicalType(&list_child_type);
    if ((__uniq_ptr_data<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true,_true>
         )local_50._M_head_impl !=
        (tuple<duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>)0x0) {
      (*(local_50._M_head_impl)->_vptr_BoundCastData[1])();
    }
  }
  else {
    *(BoundCastData **)this = local_50._M_head_impl;
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> ListReduceBind(ClientContext &context, ScalarFunction &bound_function,
                                               vector<unique_ptr<Expression>> &arguments) {

	// the list column and the bound lambda expression
	D_ASSERT(arguments.size() == 2 || arguments.size() == 3);
	if (arguments[1]->GetExpressionClass() != ExpressionClass::BOUND_LAMBDA) {
		throw BinderException("Invalid lambda expression!");
	}

	arguments[0] = BoundCastExpression::AddArrayCastToList(context, std::move(arguments[0]));

	auto &bound_lambda_expr = arguments[1]->Cast<BoundLambdaExpression>();
	if (bound_lambda_expr.parameter_count < 2 || bound_lambda_expr.parameter_count > 3) {
		throw BinderException("list_reduce expects a function with 2 or 3 arguments");
	}
	auto has_index = bound_lambda_expr.parameter_count == 3;

	unique_ptr<FunctionData> bind_data = LambdaFunctions::ListLambdaPrepareBind(arguments, context, bound_function);
	if (bind_data) {
		return bind_data;
	}

	auto list_child_type = arguments[0]->return_type;
	list_child_type = ListType::GetChildType(list_child_type);

	bool has_initial = arguments.size() == 3;
	if (has_initial) {
		const auto initial_value_type = arguments[2]->return_type;
		// Check if the initial value type is the same as the list child type and if not find the max logical type
		if (list_child_type != initial_value_type) {
			LogicalType max_logical_type;
			const auto has_max_logical_type =
			    LogicalType::TryGetMaxLogicalType(context, list_child_type, initial_value_type, max_logical_type);
			if (!has_max_logical_type) {
				throw BinderException(
				    "The initial value type must be the same as the list child type or a common super type");
			}

			list_child_type = max_logical_type;
			arguments[0] = BoundCastExpression::AddCastToType(context, std::move(arguments[0]),
			                                                  LogicalType::LIST(max_logical_type));
			arguments[2] = BoundCastExpression::AddCastToType(context, std::move(arguments[2]), max_logical_type);
		}
	}

	auto cast_lambda_expr =
	    BoundCastExpression::AddCastToType(context, std::move(bound_lambda_expr.lambda_expr), list_child_type);
	if (!cast_lambda_expr) {
		throw BinderException("Could not cast lambda expression to list child type");
	}
	bound_function.return_type = cast_lambda_expr->return_type;
	return make_uniq<ListLambdaBindData>(bound_function.return_type, std::move(cast_lambda_expr), has_index,
	                                     has_initial);
}